

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O1

void __thiscall Fl_Graphics_Driver::gap(Fl_Graphics_Driver *this)

{
  long lVar1;
  short sVar2;
  short sVar3;
  XPoint *pXVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  
  lVar7 = (long)this->gap_;
  lVar1 = lVar7 + 2;
  iVar10 = this->n;
  bVar8 = (int)lVar1 < iVar10;
  if ((int)lVar1 < iVar10) {
    pXVar4 = this->p;
    sVar2 = pXVar4[lVar7].x;
    if (pXVar4[(long)iVar10 + -1].x == sVar2) {
      sVar3 = pXVar4[lVar7].y;
      lVar5 = (long)iVar10;
      do {
        iVar10 = iVar10 + -1;
        lVar9 = lVar5 + -1;
        if (pXVar4[lVar9].y != sVar3) break;
        this->n = iVar10;
        bVar8 = lVar1 < lVar9;
        if (lVar9 <= lVar1) goto LAB_001f9e25;
        lVar6 = lVar5 + -2;
        lVar5 = lVar9;
      } while (pXVar4[lVar6].x == sVar2);
    }
    if (bVar8) {
      (*(this->super_Fl_Device)._vptr_Fl_Device[0x29])
                ((double)(int)this->p[lVar7].x,(double)(int)this->p[lVar7].y,this);
      this->gap_ = this->n;
      return;
    }
  }
LAB_001f9e25:
  this->n = this->gap_;
  return;
}

Assistant:

void Fl_Graphics_Driver::gap() {
  while (n>gap_+2 && p[n-1].x == p[gap_].x && p[n-1].y == p[gap_].y) n--;
  if (n > gap_+2) {
    transformed_vertex((COORD_T)p[gap_].x, (COORD_T)p[gap_].y);
#if defined(WIN32)
    counts[numcount++] = n-gap_;
#endif
    gap_ = n;
  } else {
    n = gap_;
  }
}